

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int lj_cf_table_sort(lua_State *L)

{
  TValue *pTVar1;
  MSize u;
  
  pTVar1 = L->base;
  if ((L->top <= pTVar1) || ((pTVar1->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  u = lj_tab_len((GCtab *)(ulong)(pTVar1->u32).lo);
  lua_settop(L,2);
  pTVar1 = L->base;
  if ((*(int *)((long)pTVar1 + 0xc) != -1) &&
     ((L->top <= pTVar1 + 1 || (*(int *)((long)pTVar1 + 0xc) != -9)))) {
    lj_err_argt(L,2,6);
  }
  auxsort(L,1,u);
  return 0;
}

Assistant:

LJLIB_CF(table_sort)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n = (int32_t)lj_tab_len(t);
  lua_settop(L, 2);
  if (!tvisnil(L->base+1))
    lj_lib_checkfunc(L, 2);
  auxsort(L, 1, n);
  return 0;
}